

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderPacked
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field,
          ObjectWriter *ow)

{
  uint32 in_EAX;
  int iVar1;
  uint32 local_38;
  Limit local_34;
  uint32 length;
  
  local_38 = in_EAX;
  io::CodedInputStream::ReadVarint32(this->stream_,&local_38);
  local_34 = io::CodedInputStream::PushLimit(this->stream_,local_38);
  while( true ) {
    iVar1 = io::CodedInputStream::BytesUntilLimit(this->stream_);
    if (iVar1 < 1) {
      io::CodedInputStream::PopLimit(this->stream_,local_34);
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    (*(this->super_ObjectSource)._vptr_ObjectSource[6])(__return_storage_ptr__,this,field,0,0,ow);
    if (__return_storage_ptr__->error_code_ != OK) break;
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_message_);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderPacked(
    const google::protobuf::Field* field, ObjectWriter* ow) const {
  uint32 length;
  stream_->ReadVarint32(&length);
  int old_limit = stream_->PushLimit(length);
  while (stream_->BytesUntilLimit() > 0) {
    RETURN_IF_ERROR(RenderField(field, StringPiece(), ow));
  }
  stream_->PopLimit(old_limit);
  return util::Status();
}